

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O2

oonf_rfc5444_interface *
oonf_rfc5444_add_interface
          (oonf_rfc5444_protocol *protocol,oonf_rfc5444_interface_listener *listener,char *name)

{
  list_entity *plVar1;
  int iVar2;
  avl_node *paVar3;
  oonf_rfc5444_interface *dest;
  uint16_t rnd;
  
  paVar3 = avl_find(&protocol->_interface_tree,name);
  if (paVar3 == (avl_node *)0x0) {
    iVar2 = os_core_linux_get_random(&rnd,2);
    if (iVar2 == 0) {
      dest = (oonf_rfc5444_interface *)oonf_class_malloc(&_interface_memcookie);
      if (dest != (oonf_rfc5444_interface *)0x0) {
        strscpy((char *)dest,name,0x10);
        dest->protocol = protocol;
        (dest->_node).key = dest;
        avl_insert(&protocol->_interface_tree,&dest->_node);
        avl_init(&dest->_target_tree,avl_comp_netaddr,false);
        (dest->_socket).config.receive_data = _cb_receive_data;
        (dest->_socket).config.dont_route = false;
        *(undefined7 *)&(dest->_socket).config.field_0x19 = 0;
        (dest->_socket).config.input_buffer = _incoming_buffer;
        (dest->_socket).config.input_buffer_length = 0x5c0;
        (dest->_socket).config.user = dest;
        (dest->_socket).cb_settings_change = _cb_interface_changed;
        (dest->_socket).config.dont_route = true;
        oonf_packet_add_managed(&dest->_socket);
        protocol->_msg_seqno = rnd;
        (dest->_listener).prev = &dest->_listener;
        (dest->_listener).next = &dest->_listener;
        protocol->_refcount = protocol->_refcount + 1;
        goto LAB_0011b7f2;
      }
    }
    else if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x237,
               (void *)0x0,0,"Could not get random data");
      return (oonf_rfc5444_interface *)0x0;
    }
    dest = (oonf_rfc5444_interface *)0x0;
  }
  else {
    dest = (oonf_rfc5444_interface *)&paVar3[-1].right;
LAB_0011b7f2:
    if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
      oonf_log(LOG_SEVERITY_INFO,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x262,
               (void *)0x0,0,"Add interface %s to protocol %s (refcount was %d)",name,protocol,
               (ulong)(uint)dest->_refcount);
    }
    dest->_refcount = dest->_refcount + 1;
    if (listener != (oonf_rfc5444_interface_listener *)0x0) {
      plVar1 = (dest->_listener).prev;
      (listener->_node).next = &dest->_listener;
      (listener->_node).prev = plVar1;
      (dest->_listener).prev = &listener->_node;
      plVar1->next = &listener->_node;
      listener->interface = dest;
    }
  }
  return dest;
}

Assistant:

struct oonf_rfc5444_interface *
oonf_rfc5444_add_interface(
  struct oonf_rfc5444_protocol *protocol, struct oonf_rfc5444_interface_listener *listener, const char *name) {
  struct oonf_rfc5444_interface *interf;
  uint16_t rnd;

  interf = oonf_rfc5444_get_interface(protocol, name);
  if (interf == NULL) {
    if (os_core_get_random(&rnd, sizeof(rnd))) {
      OONF_WARN(LOG_RFC5444, "Could not get random data");
      return NULL;
    }

    interf = oonf_class_malloc(&_interface_memcookie);
    if (interf == NULL) {
      return NULL;
    }

    /* set name */
    strscpy(interf->name, name, sizeof(interf->name));

    /* set protocol reference */
    interf->protocol = protocol;

    /* hook into protocol */
    interf->_node.key = interf->name;
    avl_insert(&protocol->_interface_tree, &interf->_node);

    /* initialize target subtree */
    avl_init(&interf->_target_tree, avl_comp_netaddr, false);

    /* initialize socket config */
    memcpy(&interf->_socket.config, &_socket_config, sizeof(_socket_config));
    interf->_socket.config.user = interf;
    interf->_socket.cb_settings_change = _cb_interface_changed;

    /* prevent routing of RFC5444 packets */
    interf->_socket.config.dont_route = true;

    /* initialize socket */
    oonf_packet_add_managed(&interf->_socket);

    /* initialize message sequence number */
    protocol->_msg_seqno = rnd;

    /* initialize listener list */
    list_init_head(&interf->_listener);

    /* increase protocol refcount */
    protocol->_refcount++;
  }

  OONF_INFO(LOG_RFC5444, "Add interface %s to protocol %s (refcount was %d)", name, protocol->name, interf->_refcount);

  /* increase reference count */
  interf->_refcount += 1;

  if (listener) {
    /* hookup listener */
    list_add_tail(&interf->_listener, &listener->_node);
    listener->interface = interf;
  }
  return interf;
}